

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_io.c
# Opt level: O0

int kvtree_open(char *file,int flags,...)

{
  uint uVar1;
  char in_AL;
  uint *puVar2;
  int *piVar3;
  char *pcVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  bool bVar5;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  int local_40;
  int local_3c;
  int tries;
  int fd;
  va_list ap;
  mode_t mode;
  int mode_set;
  int flags_local;
  char *file_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  ap[0].reg_save_area._4_4_ = 0;
  bVar5 = (flags & 0x40U) != 0;
  if (bVar5) {
    ap[0].overflow_arg_area = local_f8;
    ap[0]._0_8_ = &stack0x00000008;
    fd = 0x30;
    tries = 0x18;
    ap[0].reg_save_area._4_4_ = (uint)local_e8;
  }
  local_3c = 0xffffffff;
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  if (bVar5) {
    local_3c = open(file,flags,(ulong)ap[0].reg_save_area._4_4_);
  }
  else {
    local_3c = open(file,flags);
  }
  if (local_3c < 0) {
    puVar2 = (uint *)__errno_location();
    uVar1 = *puVar2;
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    kvtree_dbg(1,"Opening file: open(%s) errno=%d %s @ %s:%d",file,(ulong)uVar1,pcVar4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_io.c"
               ,0x5a);
    for (local_40 = 5; local_40 != 0 && local_3c < 0; local_40 = local_40 + -1) {
      usleep(100);
      if (bVar5) {
        local_3c = open(file,flags,(ulong)ap[0].reg_save_area._4_4_);
      }
      else {
        local_3c = open(file,flags);
      }
    }
    if (local_3c < 0) {
      puVar2 = (uint *)__errno_location();
      uVar1 = *puVar2;
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      kvtree_err("Opening file: open(%s) errno=%d %s @ %s:%d",file,(ulong)uVar1,pcVar4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_io.c"
                 ,0x6c);
    }
  }
  return local_3c;
}

Assistant:

int kvtree_open(const char* file, int flags, ...)
{
  /* extract the mode (see man 2 open) */
  int mode_set = 0;
  mode_t mode = 0;
  if (flags & O_CREAT) {
    va_list ap;
    va_start(ap, flags);
    mode = va_arg(ap, mode_t);
    va_end(ap);
    mode_set = 1;
  }

  int fd = -1;
  if (mode_set) {
    fd = open(file, flags, mode);
  } else {
    fd = open(file, flags);
  }
  if (fd < 0) {
    kvtree_dbg(1, "Opening file: open(%s) errno=%d %s @ %s:%d",
      file, errno, strerror(errno), __FILE__, __LINE__
    );

    /* try again */
    int tries = KVTREE_OPEN_TRIES;
    while (tries && fd < 0) {
      usleep(KVTREE_OPEN_USLEEP);
      if (mode_set) {
        fd = open(file, flags, mode);
      } else {
        fd = open(file, flags);
      }
      tries--;
    }

    /* if we still don't have a valid file, consider it an error */
    if (fd < 0) {
      kvtree_err("Opening file: open(%s) errno=%d %s @ %s:%d",
        file, errno, strerror(errno), __FILE__, __LINE__
      );
    }
  }
  return fd;
}